

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VmConstant *
CreateConstantPointer
          (Allocator *allocator,SynBase *source,int offset,VariableData *container,
          TypeBase *structType,bool trackUsers)

{
  int iVar1;
  VmConstant **ppVVar2;
  undefined4 extraout_var;
  VmType type;
  VmConstant *result;
  SynBase *local_40;
  int local_34;
  VmConstant *this;
  
  local_40 = source;
  if ((structType != (TypeBase *)0x0) &&
     ((structType->typeID == 0xb || (structType->typeID == 0x12)))) {
    if (container != (VariableData *)0x0 && trackUsers) {
      result = (VmConstant *)CONCAT44(result._4_4_,offset + 1);
      ppVVar2 = SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::find
                          (&container->offsetUsers,(int *)&result);
      if ((ppVVar2 != (VmConstant **)0x0) && (*ppVVar2 != (VmConstant *)0x0)) {
        return *ppVVar2;
      }
    }
    iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
    this = (VmConstant *)CONCAT44(extraout_var,iVar1);
    type = VmType::Pointer(structType);
    VmConstant::VmConstant(this,allocator,type,local_40);
    this->iValue = offset;
    this->container = container;
    result = this;
    if (container != (VariableData *)0x0 && trackUsers) {
      SmallArray<VmConstant_*,_8U>::push_back(&container->users,&result);
      local_34 = offset + 1;
      SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
                (&container->offsetUsers,&local_34,&result);
    }
    return result;
  }
  __assert_fail("isType<TypeRef>(structType) || isType<TypeNullptr>(structType)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                ,0x61,
                "VmConstant *CreateConstantPointer(Allocator *, SynBase *, int, VariableData *, TypeBase *, bool)"
               );
}

Assistant:

VmConstant* CreateConstantPointer(Allocator *allocator, SynBase *source, int offset, VariableData *container, TypeBase *structType, bool trackUsers)
{
	assert(isType<TypeRef>(structType) || isType<TypeNullptr>(structType));

	if(trackUsers && container)
	{
		if(VmConstant **cached = container->offsetUsers.find(offset + 1))
		{
			if (VmConstant *constant = *cached)
				return constant;
		}
	}

	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Pointer(structType), source);

	result->iValue = offset;
	result->container = container;

	if(trackUsers && container)
	{
		container->users.push_back(result);
		container->offsetUsers.insert(offset + 1, result);
	}

	return result;
}